

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderCommonFunctionTests.cpp
# Opt level: O1

vector<void_*,_std::allocator<void_*>_> *
deqp::gles31::Functional::getInputOutputPointers
          (vector<void_*,_std::allocator<void_*>_> *__return_storage_ptr__,
          vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
          *symbols,vector<unsigned_int,_std::allocator<unsigned_int>_> *data,int numValues)

{
  undefined4 in_EAX;
  int iVar1;
  int iVar2;
  pointer pSVar3;
  long lVar4;
  long lVar5;
  undefined4 uStack_38;
  int local_34;
  
  _uStack_38 = CONCAT44(numValues,in_EAX);
  std::vector<void_*,_std::allocator<void_*>_>::vector
            (__return_storage_ptr__,
             ((long)(symbols->
                    super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(symbols->
                    super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7,
             (allocator_type *)((long)&uStack_38 + 3));
  pSVar3 = (symbols->
           super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(symbols->
                              super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pSVar3) >> 3) *
          -0x49249249) {
    lVar4 = 0;
    lVar5 = 0x20;
    iVar2 = 0;
    do {
      iVar1 = glu::VarType::getScalarSize
                        ((VarType *)((long)&(pSVar3->name)._M_dataplus._M_p + lVar5));
      (__return_storage_ptr__->super__Vector_base<void_*,_std::allocator<void_*>_>)._M_impl.
      super__Vector_impl_data._M_start[lVar4] =
           (data->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start + iVar2;
      iVar2 = iVar2 + iVar1 * local_34;
      lVar4 = lVar4 + 1;
      pSVar3 = (symbols->
               super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar5 = lVar5 + 0x38;
    } while (lVar4 < (int)((ulong)((long)(symbols->
                                         super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                                         )._M_impl.super__Vector_impl_data._M_finish - (long)pSVar3)
                          >> 3) * -0x49249249);
  }
  return __return_storage_ptr__;
}

Assistant:

static vector<void*> getInputOutputPointers (const vector<Symbol>& symbols, vector<deUint32>& data, const int numValues)
{
	vector<void*>	pointers		(symbols.size());
	int				curScalarOffset	= 0;

	for (int varNdx = 0; varNdx < (int)symbols.size(); ++varNdx)
	{
		const Symbol&	var				= symbols[varNdx];
		const int		scalarSize		= var.varType.getScalarSize();

		// Uses planar layout as input/output specs do not support strides.
		pointers[varNdx] = &data[curScalarOffset];
		curScalarOffset += scalarSize*numValues;
	}

	DE_ASSERT(curScalarOffset == (int)data.size());

	return pointers;
}